

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O2

void __thiscall Storage::Disk::PCMTrack::PCMTrack(PCMTrack *this,PCMSegment *segment)

{
  PCMSegment length_adjusted_segment;
  PCMSegment local_68;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__PCMTrack_0058ee30;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segment_event_sources_).
  super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->segment_pointer_ = 0;
  this->is_resampled_clone_ = false;
  PCMSegment::PCMSegment(&local_68,segment);
  local_68.length_of_a_bit.length = 1;
  local_68.length_of_a_bit.clock_rate =
       (*(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
       *(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
       (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  std::
  vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ::emplace_back<Storage::Disk::PCMSegment>(&this->segment_event_sources_,&local_68);
  PCMSegment::~PCMSegment(&local_68);
  return;
}

Assistant:

PCMTrack::PCMTrack(const PCMSegment &segment) : PCMTrack() {
	// a single segment necessarily fills the track
	PCMSegment length_adjusted_segment = segment;
	length_adjusted_segment.length_of_a_bit.length = 1;
	length_adjusted_segment.length_of_a_bit.clock_rate = unsigned(segment.data.size());
	segment_event_sources_.emplace_back(std::move(length_adjusted_segment));
}